

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

bool __thiscall SQCompiler::Compile(SQCompiler *this,SQObjectPtr *o)

{
  SQFuncState *pSVar1;
  SQCOMPILERERROR p_Var2;
  long lVar3;
  int iVar4;
  SQString *pSVar5;
  SQInteger n;
  SQFunctionProto *x;
  _HashNode **pp_Var6;
  HSQUIRRELVM pSVar7;
  SQObject SVar8;
  SQObject local_248;
  SQFuncState funcstate;
  
  this->_debugline = 1;
  this->_debugop = 0;
  SQFuncState::SQFuncState(&funcstate,this->_vm->_sharedstate,(SQFuncState *)0x0,ThrowError,this);
  pSVar5 = SQString::Create(this->_vm->_sharedstate,"main",-1);
  SQObjectPtr::operator=(&funcstate._name,pSVar5);
  this->_fs = &funcstate;
  SVar8 = SQFuncState::CreateString(&funcstate,"this",-1);
  local_248._unVal = SVar8._unVal;
  local_248._type = SVar8._type;
  SQFuncState::AddParameter(&funcstate,&local_248);
  pSVar1 = this->_fs;
  SVar8 = SQFuncState::CreateString(pSVar1,"vargv",-1);
  local_248._unVal = SVar8._unVal;
  local_248._type = SVar8._type;
  SQFuncState::AddParameter(pSVar1,&local_248);
  pSVar1 = this->_fs;
  pSVar1->_varparams = true;
  SQObjectPtr::operator=(&pSVar1->_sourcename,&this->_sourcename);
  n = SQFuncState::GetStackSize(this->_fs);
  iVar4 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar4 == 0) {
    Lex(this);
    while (0 < this->_token) {
      Statement(this,true);
      lVar3 = (this->_lex)._prevtoken;
      if ((lVar3 != 0x3b) && (lVar3 != 0x7d)) {
        OptionalSemicolon(this);
      }
    }
    SQFuncState::SetStackSize(this->_fs,n);
    SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,this->_lineinfo,true);
    SQFuncState::AddInstruction(this->_fs,_OP_RETURN,0xff,0,0,0);
    SQFuncState::SetStackSize(this->_fs,0);
    x = SQFuncState::BuildProto(this->_fs);
    SQObjectPtr::operator=(o,x);
  }
  else {
    pSVar7 = this->_vm;
    if ((this->_raiseerror == true) &&
       (p_Var2 = pSVar7->_sharedstate->_compilererrorhandler, p_Var2 != (SQCOMPILERERROR)0x0)) {
      pp_Var6 = (_HashNode **)"unknown";
      if ((this->_sourcename).super_SQObject._type == OT_STRING) {
        pp_Var6 = &((this->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      (*p_Var2)(pSVar7,this->_compilererror,(SQChar *)pp_Var6,(this->_lex)._currentline,
                (this->_lex)._currentcolumn);
      pSVar7 = this->_vm;
    }
    pSVar5 = SQString::Create(pSVar7->_sharedstate,this->_compilererror,-1);
    SQObjectPtr::operator=(&this->_vm->_lasterror,pSVar5);
  }
  SQFuncState::~SQFuncState(&funcstate);
  return iVar4 == 0;
}

Assistant:

bool Compile(SQObjectPtr &o)
    {
        _debugline = 1;
        _debugop = 0;

        SQFuncState funcstate(_ss(_vm), NULL,ThrowError,this);
        funcstate._name = SQString::Create(_ss(_vm), _SC("main"));
        _fs = &funcstate;
        _fs->AddParameter(_fs->CreateString(_SC("this")));
        _fs->AddParameter(_fs->CreateString(_SC("vargv")));
        _fs->_varparams = true;
        _fs->_sourcename = _sourcename;
        SQInteger stacksize = _fs->GetStackSize();
        if(setjmp(_errorjmp) == 0) {
            Lex();
            while(_token > 0){
                Statement();
                if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            }
            _fs->SetStackSize(stacksize);
            _fs->AddLineInfos(_lex._currentline, _lineinfo, true);
            _fs->AddInstruction(_OP_RETURN, 0xFF);
            _fs->SetStackSize(0);
            o =_fs->BuildProto();
#ifdef _DEBUG_DUMP
            _fs->Dump(_funcproto(o));
#endif
        }
        else {
            if(_raiseerror && _ss(_vm)->_compilererrorhandler) {
                _ss(_vm)->_compilererrorhandler(_vm, _compilererror, sq_type(_sourcename) == OT_STRING?_stringval(_sourcename):_SC("unknown"),
                    _lex._currentline, _lex._currentcolumn);
            }
            _vm->_lasterror = SQString::Create(_ss(_vm), _compilererror, -1);
            return false;
        }
        return true;
    }